

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O2

int32_t get_mult_shift_ndiag(int64_t Px,int16_t iDet,int shift)

{
  byte bVar1;
  int32_t iVar2;
  long lVar3;
  long lVar4;
  undefined2 in_register_00000032;
  
  bVar1 = (byte)shift;
  lVar4 = CONCAT22(in_register_00000032,iDet) * Px;
  lVar3 = (1L << (bVar1 & 0x3f)) >> 1;
  if (lVar4 < 0) {
    lVar3 = -(lVar3 - lVar4 >> (bVar1 & 0x3f));
  }
  else {
    lVar3 = lVar3 + lVar4 >> (bVar1 & 0x3f);
  }
  lVar4 = 0x1fff;
  if (lVar3 < 0x1fff) {
    lVar4 = lVar3;
  }
  iVar2 = -0x1fff;
  if (-0x1fff < lVar4) {
    iVar2 = (int32_t)lVar4;
  }
  return iVar2;
}

Assistant:

static int32_t get_mult_shift_ndiag(int64_t Px, int16_t iDet, int shift) {
  int64_t v = Px * (int64_t)iDet;
  return (int32_t)clamp64(ROUND_POWER_OF_TWO_SIGNED_64(v, shift),
                          -WARPEDMODEL_NONDIAGAFFINE_CLAMP + 1,
                          WARPEDMODEL_NONDIAGAFFINE_CLAMP - 1);
}